

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

int Abc_ConvertAigToGia(Gia_Man_t *p,Hop_Obj_t *pRoot)

{
  int iVar1;
  
  if (((ulong)pRoot & 1) == 0) {
    iVar1 = 1;
    if ((*(uint *)&pRoot->field_0x20 & 7) != 1) {
      Abc_ConvertAigToGia_rec1(p,pRoot);
      Abc_ConvertAigToGia_rec2(pRoot);
      iVar1 = (pRoot->field_0).iData;
    }
    return iVar1;
  }
  __assert_fail("!Hop_IsComplement(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFunc.c"
                ,0x3bb,"int Abc_ConvertAigToGia(Gia_Man_t *, Hop_Obj_t *)");
}

Assistant:

int Abc_ConvertAigToGia( Gia_Man_t * p, Hop_Obj_t * pRoot )
{
    assert( !Hop_IsComplement(pRoot) );
    if ( Hop_ObjIsConst1( pRoot ) )
        return 1;
    Abc_ConvertAigToGia_rec1( p, pRoot );
    Abc_ConvertAigToGia_rec2( pRoot );
    return pRoot->iData;
}